

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidget::wheelEvent(QGraphicsProxyWidget *this,QGraphicsSceneWheelEvent *event)

{
  bool bVar1;
  ScrollPhase SVar2;
  Orientation OVar3;
  MouseButtons MVar4;
  QFlagsStorage<Qt::KeyboardModifier> QVar5;
  ScrollPhase SVar6;
  QWidget *pQVar7;
  QPoint QVar8;
  QEvent *in_RSI;
  long in_FS_OFFSET;
  QGraphicsProxyWidgetPrivate *d;
  QPointer<QWidget> focusWidget;
  QWheelEvent wheelEvent;
  QPoint angleDelta;
  QPointer<QWidget> prev_grabber;
  QPointer<QWidget> receiver;
  QPointF pos;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  QGraphicsProxyWidgetPrivate *in_stack_fffffffffffffea8;
  undefined1 local_f0 [24];
  QPoint *local_d8;
  QPoint local_d0;
  undefined1 local_c8 [16];
  QWheelEvent local_b8 [96];
  QPoint *local_58;
  QPointF local_50;
  undefined1 *local_40;
  undefined1 *local_38;
  QPoint local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsProxyWidget *)0x9bd2c0);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bd2d6);
  if (!bVar1) goto LAB_009bd7b1;
  local_18.yp = -NAN;
  local_18.xp = -NAN;
  local_18 = QGraphicsSceneWheelEvent::pos
                       ((QGraphicsSceneWheelEvent *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bd348);
  local_30 = QPointF::toPoint((QPointF *)
                              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  QWidget::childAt((QWidget *)in_stack_fffffffffffffea8,
                   (QPoint *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bd391);
  if (!bVar1) {
    QPointer<QWidget>::operator=
              ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QWidget>::QPointer
            ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  SVar2 = QGraphicsSceneWheelEvent::phase
                    ((QGraphicsSceneWheelEvent *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  if (SVar2 == ScrollBegin) {
    QPointer<QWidget>::operator=
              ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
LAB_009bd447:
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bd45e);
    local_50 = QGraphicsProxyWidgetPrivate::mapToReceiver
                         (in_stack_fffffffffffffea8,
                          (QPointF *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                          pQVar7);
    local_58 = (QPoint *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = local_50;
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    OVar3 = QGraphicsSceneWheelEvent::orientation
                      ((QGraphicsSceneWheelEvent *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if (OVar3 == Horizontal) {
      QGraphicsSceneWheelEvent::delta
                ((QGraphicsSceneWheelEvent *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe8c);
    }
    else {
      QGraphicsSceneWheelEvent::delta
                ((QGraphicsSceneWheelEvent *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe8c);
    }
    memset(local_b8,0xaa,0x60);
    local_d0 = QGraphicsSceneWheelEvent::screenPos
                         ((QGraphicsSceneWheelEvent *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QVar8 = QGraphicsSceneWheelEvent::pixelDelta
                      ((QGraphicsSceneWheelEvent *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_d8 = local_58;
    MVar4 = QGraphicsSceneWheelEvent::buttons
                      ((QGraphicsSceneWheelEvent *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    QVar5.i = (Int)QGraphicsSceneWheelEvent::modifiers
                             ((QGraphicsSceneWheelEvent *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    SVar2 = QGraphicsSceneWheelEvent::phase
                      ((QGraphicsSceneWheelEvent *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    bVar1 = QGraphicsSceneWheelEvent::isInverted
                      ((QGraphicsSceneWheelEvent *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    QString::QString((QString *)0x9bd5a6);
    pQVar7 = (QWidget *)QPointingDevice::primaryPointingDevice((QString *)local_f0);
    QWheelEvent::QWheelEvent
              (local_b8,(QPointF *)&local_18,(QPointF *)local_c8,(QPoint *)QVar8,local_d8,
               (QFlags_conflict1 *)
               (ulong)(uint)MVar4.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                            super_QFlagsStorage<Qt::MouseButton>.i,
               (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffe8c,QVar5.i),SVar2,bVar1,
               MouseEventSynthesizedByQt,(QPointingDevice *)pQVar7);
    QString::~QString((QString *)0x9bd61a);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bd646);
    QWidget::focusWidget((QWidget *)0x9bd64e);
    QPointer<QWidget>::QPointer<void>
              ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe94,SVar2),
               (QWidget *)CONCAT44(in_stack_fffffffffffffe8c,QVar5.i));
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bd668);
    qt_sendSpontaneousEvent
              ((QObject *)CONCAT44(in_stack_fffffffffffffe94,SVar2),
               (QEvent *)CONCAT44(in_stack_fffffffffffffe8c,QVar5.i));
    bVar1 = QEvent::isAccepted((QEvent *)local_b8);
    (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
    SVar6 = QGraphicsSceneWheelEvent::phase
                      ((QGraphicsSceneWheelEvent *)CONCAT44(in_stack_fffffffffffffe94,SVar2));
    if ((SVar6 == ScrollBegin) && (bVar1 = QEvent::isAccepted((QEvent *)local_b8), !bVar1)) {
      QPointer<QWidget>::operator=
                ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe94,SVar2),
                 (QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe8c,QVar5.i));
    }
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bd6e5);
    if (bVar1) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bd6f8);
      bVar1 = QWidget::hasFocus(pQVar7);
      if (!bVar1) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bd70e);
        QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,QVar5.i));
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bd727);
        QWidget::focusWidget((QWidget *)0x9bd72f);
        QPointer<QWidget>::operator=
                  ((QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffe94,SVar2),
                   (QWidget *)CONCAT44(in_stack_fffffffffffffe8c,QVar5.i));
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bd746);
        if (bVar1) {
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bd756);
          bVar1 = QWidget::hasFocus(pQVar7);
          if (bVar1) {
            QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bd76e);
            QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,QVar5.i));
          }
        }
      }
    }
    QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x9bd782);
    QWheelEvent::~QWheelEvent(local_b8);
  }
  else {
    SVar2 = QGraphicsSceneWheelEvent::phase
                      ((QGraphicsSceneWheelEvent *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if ((SVar2 == NoScrollPhase) ||
       (bVar1 = ::operator!=((QPointer<QWidget> *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (QPointer<QWidget> *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)), !bVar1)
       ) goto LAB_009bd447;
    QEvent::ignore(in_RSI);
  }
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x9bd7a4);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x9bd7b1);
LAB_009bd7b1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::wheelEvent(QGraphicsSceneWheelEvent *event)
{
    Q_D(QGraphicsProxyWidget);
#ifdef GRAPHICSPROXYWIDGET_DEBUG
    qDebug("QGraphicsProxyWidget::wheelEvent");
#endif
    if (!d->widget)
        return;

    QPointF pos = event->pos();
    QPointer<QWidget> receiver = d->widget->childAt(pos.toPoint());
    if (!receiver)
        receiver = d->widget;

    // high precision event streams go to the grabber, which will be the
    // QGraphicsView's viewport. We need to change that temporarily, otherwise
    // the event we send to the receiver get grabbed by the viewport, resulting
    // in infinite recursion
    QPointer<QWidget> prev_grabber = QApplicationPrivate::wheel_widget;
    if (event->phase() == Qt::ScrollBegin) {
        QApplicationPrivate::wheel_widget = receiver;
    } else if (event->phase() != Qt::NoScrollPhase && QApplicationPrivate::wheel_widget != receiver) {
        // this event is part of a stream that didn't start here, so ignore
        event->ignore();
        return;
    }

    // Map event position from us to the receiver
    pos = d->mapToReceiver(pos, receiver);

    // Send mouse event.
    QPoint angleDelta;
    if (event->orientation() == Qt::Horizontal)
        angleDelta.setX(event->delta());
    else
        angleDelta.setY(event->delta());
    // pixelDelta, inverted, scrollPhase and source from the original QWheelEvent
    // were not preserved in the QGraphicsSceneWheelEvent unfortunately
    QWheelEvent wheelEvent(pos, event->screenPos(), event->pixelDelta(), angleDelta,
                           event->buttons(), event->modifiers(), event->phase(),
                           event->isInverted(), Qt::MouseEventSynthesizedByQt,
                           QPointingDevice::primaryPointingDevice());
    QPointer<QWidget> focusWidget = d->widget->focusWidget();
    extern bool qt_sendSpontaneousEvent(QObject *, QEvent *);
    qt_sendSpontaneousEvent(receiver, &wheelEvent);
    event->setAccepted(wheelEvent.isAccepted());

    if (event->phase() == Qt::ScrollBegin) {
        // reset the wheel grabber if the event wasn't accepted
        if (!wheelEvent.isAccepted())
            QApplicationPrivate::wheel_widget = prev_grabber;
    }

    // ### Remove, this should be done by proper focusIn/focusOut events.
    if (focusWidget && !focusWidget->hasFocus()) {
        focusWidget->update();
        focusWidget = d->widget->focusWidget();
        if (focusWidget && focusWidget->hasFocus())
            focusWidget->update();
    }
}